

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_perform_search(Curl_easy *data)

{
  IMAP *pIVar1;
  IMAP *imap;
  CURLcode result;
  Curl_easy *data_local;
  
  pIVar1 = (data->req).p.imap;
  if (pIVar1->query == (char *)0x0) {
    Curl_failf(data,"Cannot SEARCH without a query string.");
    data_local._4_4_ = CURLE_URL_MALFORMAT;
  }
  else {
    data_local._4_4_ = imap_sendf(data,"SEARCH %s",pIVar1->query);
    if (data_local._4_4_ == CURLE_OK) {
      imap_state(data,IMAP_SEARCH);
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode imap_perform_search(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct IMAP *imap = data->req.p.imap;

  /* Check we have a query string */
  if(!imap->query) {
    failf(data, "Cannot SEARCH without a query string.");
    return CURLE_URL_MALFORMAT;
  }

  /* Send the SEARCH command */
  result = imap_sendf(data, "SEARCH %s", imap->query);

  if(!result)
    imap_state(data, IMAP_SEARCH);

  return result;
}